

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O3

void matrixToHPR_new(TMATRIX *rotation,EulerAngles *hpr)

{
  float fVar1;
  bool bVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  fVar8 = rotation->Data[0][2];
  fVar4 = -fVar8;
  fVar5 = -1.0;
  if (-1.0 <= fVar4) {
    fVar5 = fVar4;
  }
  uVar3 = -(uint)(fVar8 < -1.0);
  dVar6 = asin((double)(float)(uVar3 & 0x3f800000 | ~uVar3 & (uint)fVar5));
  KDIS::DATA_TYPE::EulerAngles::SetThetaInRadians(hpr,(KFLOAT32)(float)dVar6);
  dVar6 = cos(dVar6);
  dVar6 = 0.0 - dVar6;
  bVar2 = dVar6 < 9.999999747378752e-06;
  if (dVar6 < 0.0) {
    bVar2 = -9.999999747378752e-06 < dVar6;
  }
  if (bVar2) {
    fVar8 = rotation->Data[1][1];
    fVar5 = rotation->Data[2][1];
    fVar4 = -1.0;
    if (-1.0 <= fVar8) {
      fVar4 = fVar8;
    }
    fVar7 = (float)(-(uint)(1.0 < fVar8) & 0x3f800000 | ~-(uint)(1.0 < fVar8) & (uint)fVar4);
    fVar4 = -fVar5;
    uVar3 = -(uint)(fVar5 < -1.0);
    fVar8 = -1.0;
    if (-1.0 <= fVar4) {
      fVar8 = fVar4;
    }
    fVar5 = (float)(uVar3 & 0x3f800000 | ~uVar3 & (uint)fVar8);
    KDIS::DATA_TYPE::EulerAngles::SetPsiInRadians(hpr,0.0);
  }
  else {
    fVar8 = rotation->Data[1][2];
    fVar5 = -1.0;
    if (-1.0 <= fVar8) {
      fVar5 = fVar8;
    }
    fVar5 = (float)(-(uint)(1.0 < fVar8) & 0x3f800000 | ~-(uint)(1.0 < fVar8) & (uint)fVar5);
    fVar8 = rotation->Data[2][2];
    fVar4 = -1.0;
    if (-1.0 <= fVar8) {
      fVar4 = fVar8;
    }
    fVar7 = (float)(-(uint)(1.0 < fVar8) & 0x3f800000 | ~-(uint)(1.0 < fVar8) & (uint)fVar4);
    fVar8 = rotation->Data[0][0];
    fVar4 = rotation->Data[0][1];
    fVar1 = -1.0;
    if (-1.0 <= fVar4) {
      fVar1 = fVar4;
    }
    fVar9 = -1.0;
    if (-1.0 <= fVar8) {
      fVar9 = fVar8;
    }
    dVar6 = atan2((double)(float)(-(uint)(1.0 < fVar4) & 0x3f800000 |
                                 ~-(uint)(1.0 < fVar4) & (uint)fVar1),
                  (double)(float)(-(uint)(1.0 < fVar8) & 0x3f800000 |
                                 ~-(uint)(1.0 < fVar8) & (uint)fVar9));
    KDIS::DATA_TYPE::EulerAngles::SetPsiInRadians(hpr,(KFLOAT32)(float)dVar6);
  }
  dVar6 = atan2((double)fVar5,(double)fVar7);
  KDIS::DATA_TYPE::EulerAngles::SetPhiInRadians(hpr,(KFLOAT32)(float)dVar6);
  return;
}

Assistant:

void matrixToHPR_new( const TMATRIX& rotation, EulerAngles & hpr )
{
    static const float PRECISION = MAGIC_EPSILON;
    KFLOAT64 sin_pitch = clampVal( -rotation.Data[0][2], 1.0f ); // -mat(0,2)
    KFLOAT64 pitch = asin( sin_pitch );
    hpr.SetThetaInRadians( pitch );

    KFLOAT64 cp = cos( pitch );
    if (equivalent<double>(cp, 0, PRECISION))
    {
        KFLOAT64 cr = clampVal(rotation.Data[1][1],1.0f);
        KFLOAT64 sr = clampVal(-rotation.Data[2][1],1.0f);
        hpr.SetPsiInRadians( 0.0f );
        hpr.SetPhiInRadians( atan2( sr,cr ) );
    } else {
        KFLOAT64 sr = clampVal(rotation.Data[1][2],1.0f);
        KFLOAT64 cr = clampVal(rotation.Data[2][2],1.0f);
        float sgnr = (sr < 0) ? -1.0f : 1.0f;

        KFLOAT64 sh = clampVal(rotation.Data[0][1],1.0f);
        KFLOAT64 ch = clampVal(rotation.Data[0][0],1.0f);
        float sgnh = (sh < 0) ? -1.0f : 1.0f;

        //hpr.SetPsiInRadians( acos ( ch / cp )*sgnh );
        //hpr.SetPhiInRadians( acos( cr / cp)*sgnr);
        hpr.SetPsiInRadians( atan2 (sh,ch ) );
        hpr.SetPhiInRadians( atan2 (sr,cr ) );
    }
}